

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_buffer_get_byteLength(JSContext *ctx,JSValue this_val,int class_id)

{
  uint uVar1;
  uint *puVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  int64_t iVar5;
  JSValue JVar6;
  
  puVar2 = (uint *)JS_GetOpaque2(ctx,this_val,class_id);
  if (puVar2 == (uint *)0x0) {
    JVar3.float64 = 0.0;
    iVar5 = 6;
  }
  else {
    uVar1 = *puVar2;
    JVar4 = (JSValueUnion)(long)(int)uVar1;
    JVar3.float64 = (double)uVar1;
    if (-1 < (long)JVar4.ptr) {
      JVar3 = JVar4;
    }
    iVar5 = 7;
    if (-1 < (long)JVar4.ptr) {
      iVar5 = 0;
    }
  }
  JVar6.tag = iVar5;
  JVar6.u.float64 = JVar3.float64;
  return JVar6;
}

Assistant:

static JSValue js_array_buffer_get_byteLength(JSContext *ctx,
                                              JSValueConst this_val,
                                              int class_id)
{
    JSArrayBuffer *abuf = JS_GetOpaque2(ctx, this_val, class_id);
    if (!abuf)
        return JS_EXCEPTION;
    /* return 0 if detached */
    return JS_NewUint32(ctx, abuf->byte_length);
}